

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O2

void __thiscall wasm::ReFinalize::visitResume(ReFinalize *this,Resume *curr)

{
  string_view name;
  Name *pNVar1;
  Type *pTVar2;
  size_t i;
  ulong index;
  
  Resume::finalize(curr);
  for (index = 0;
      index < (curr->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements; index = index + 1) {
    pNVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->handlerBlocks).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
    name = (pNVar1->super_IString).str;
    pTVar2 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                       (&(curr->sentTypes).
                         super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,index);
    updateBreakValueType(this,(Name)name,(Type)pTVar2->id);
  }
  return;
}

Assistant:

void ReFinalize::visitResume(Resume* curr) {
  curr->finalize();
  for (size_t i = 0; i < curr->handlerBlocks.size(); i++) {
    updateBreakValueType(curr->handlerBlocks[i], curr->sentTypes[i]);
  }
}